

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O1

void htmlAutoCloseOnEnd(htmlParserCtxtPtr ctxt)

{
  int iVar1;
  endElementSAXFunc p_Var2;
  long lVar3;
  int iVar4;
  
  if (0 < ctxt->nameNr) {
    iVar4 = ctxt->nameNr + 1;
    do {
      if ((ctxt->sax != (_xmlSAXHandler *)0x0) &&
         (p_Var2 = ctxt->sax->endElement, p_Var2 != (endElementSAXFunc)0x0)) {
        (*p_Var2)(ctxt->userData,ctxt->name);
      }
      iVar1 = ctxt->nameNr;
      lVar3 = (long)iVar1;
      if (0 < lVar3) {
        ctxt->nameNr = iVar1 + -1;
        if (iVar1 == 1) {
          ctxt->name = (xmlChar *)0x0;
        }
        else {
          ctxt->name = ctxt->nameTab[lVar3 + -2];
        }
        ctxt->nameTab[lVar3 + -1] = (xmlChar *)0x0;
      }
      iVar4 = iVar4 + -1;
    } while (1 < iVar4);
  }
  return;
}

Assistant:

static void
htmlAutoCloseOnEnd(htmlParserCtxtPtr ctxt)
{
    int i;

    if (ctxt->nameNr == 0)
        return;
    for (i = (ctxt->nameNr - 1); i >= 0; i--) {
        if ((ctxt->sax != NULL) && (ctxt->sax->endElement != NULL))
            ctxt->sax->endElement(ctxt->userData, ctxt->name);
	htmlnamePop(ctxt);
    }
}